

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

App * __thiscall
CLI::App::add_subcommand(App *this,string *subcommand_name,string *subcommand_description)

{
  byte bVar1;
  byte *pbVar2;
  size_type sVar3;
  bool bVar4;
  App *this_00;
  App *pAVar5;
  IncorrectConstruction *pIVar6;
  size_type sVar7;
  allocator<char> local_111;
  App *local_110;
  App_p subcom;
  App_p local_e8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_110 = this;
  if (subcommand_name->_M_string_length != 0) {
    bVar4 = CLI::detail::valid_name_string(subcommand_name);
    if (!bVar4) {
      pbVar2 = (byte *)(subcommand_name->_M_dataplus)._M_p;
      bVar1 = *pbVar2;
      if ((bVar1 == 0x2d) || (bVar1 < 0x22)) {
        pIVar6 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,
                   "Subcommand name starts with invalid character, \'!\' and \'-\' and control characters"
                   ,(allocator<char> *)&subcom);
        IncorrectConstruction::IncorrectConstruction(pIVar6,&local_50);
        __cxa_throw(pIVar6,&IncorrectConstruction::typeinfo,Error::~Error);
      }
      sVar3 = subcommand_name->_M_string_length;
      sVar7 = 0;
      while (sVar3 != sVar7) {
        bVar1 = pbVar2[sVar7];
        bVar4 = CLI::detail::valid_later_char<char>(bVar1);
        sVar7 = sVar7 + 1;
        if (!bVar4) {
          pIVar6 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,"Subcommand name contains invalid character (\'",&local_111
                    );
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &subcom,&local_90,bVar1);
          ::std::operator+(&local_70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &subcom,
                           "\'), all characters are allowed except\'=\',\':\',\'{\',\'}\', \' \', and control characters"
                          );
          IncorrectConstruction::IncorrectConstruction(pIVar6,&local_70);
          __cxa_throw(pIVar6,&IncorrectConstruction::typeinfo,Error::~Error);
        }
      }
    }
  }
  this_00 = (App *)operator_new(0x360);
  ::std::__cxx11::string::string(&local_b0,subcommand_description);
  ::std::__cxx11::string::string((string *)&local_d0,subcommand_name);
  pAVar5 = local_110;
  App(this_00,&local_b0,&local_d0,local_110);
  ::std::__shared_ptr<CLI::App,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<CLI::App,void>
            ((__shared_ptr<CLI::App,(__gnu_cxx::_Lock_policy)2> *)&subcom,this_00);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  local_e8.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       subcom.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_e8.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       subcom.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  subcom.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  subcom.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pAVar5 = add_subcommand(pAVar5,&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&subcom.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return pAVar5;
}

Assistant:

CLI11_INLINE App *App::add_subcommand(std::string subcommand_name, std::string subcommand_description) {
    if(!subcommand_name.empty() && !detail::valid_name_string(subcommand_name)) {
        if(!detail::valid_first_char(subcommand_name[0])) {
            throw IncorrectConstruction(
                "Subcommand name starts with invalid character, '!' and '-' and control characters");
        }
        for(auto c : subcommand_name) {
            if(!detail::valid_later_char(c)) {
                throw IncorrectConstruction(std::string("Subcommand name contains invalid character ('") + c +
                                            "'), all characters are allowed except"
                                            "'=',':','{','}', ' ', and control characters");
            }
        }
    }
    CLI::App_p subcom = std::shared_ptr<App>(new App(std::move(subcommand_description), subcommand_name, this));
    return add_subcommand(std::move(subcom));
}